

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereSphereCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtSphereSphereCollisionAlgorithm::processCollision
          (cbtSphereSphereCollisionAlgorithm *this,cbtCollisionObjectWrapper *col0Wrap,
          cbtCollisionObjectWrapper *col1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  undefined8 uVar2;
  cbtPersistentManifold *this_00;
  float fVar3;
  int iVar4;
  cbtManifoldPoint *pt;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  cbtVector3 pos1;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  this_00 = this->m_manifoldPtr;
  if (this_00 != (cbtPersistentManifold *)0x0) {
    resultOut->m_manifoldPtr = this_00;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(col0Wrap->m_worldTransform->m_origin).m_floats;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(col1Wrap->m_worldTransform->m_origin).m_floats;
    _local_48 = vsubps_avx(auVar6,auVar8);
    fVar3 = (col0Wrap->m_worldTransform->m_origin).m_floats[2] -
            (col1Wrap->m_worldTransform->m_origin).m_floats[2];
    auVar7._0_4_ = local_48._0_4_ * local_48._0_4_;
    auVar7._4_4_ = local_48._4_4_ * local_48._4_4_;
    auVar7._8_4_ = local_48._8_4_ * local_48._8_4_;
    auVar7._12_4_ = local_48._12_4_ * local_48._12_4_;
    auVar6 = vmovshdup_avx(auVar7);
    fVar1 = *(float *)&col0Wrap->m_shape[1].field_0xc;
    auVar6 = vfmadd231ss_fma(auVar6,_local_48,_local_48);
    fVar11 = *(float *)&col0Wrap->m_shape->field_0x1c;
    iVar4 = this_00->m_cachedPoints;
    fVar13 = *(float *)&col1Wrap->m_shape[1].field_0xc * *(float *)&col1Wrap->m_shape->field_0x1c;
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    local_58 = ZEXT416((uint)fVar13);
    if (0 < iVar4) {
      pt = this_00->m_pointCache;
      lVar5 = 0;
      do {
        cbtPersistentManifold::clearUserCache(this_00,pt);
        iVar4 = this_00->m_cachedPoints;
        lVar5 = lVar5 + 1;
        pt = pt + 1;
      } while (lVar5 < iVar4);
      fVar13 = (float)local_58._0_4_;
    }
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar12 = auVar6._0_4_;
    if (iVar4 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
      local_68._0_8_ = this_00;
      (*gContactEndedCallback)((cbtPersistentManifold **)local_68);
      fVar13 = local_58._0_4_;
    }
    fVar1 = fVar13 + fVar1 * fVar11;
    this_00->m_cachedPoints = 0;
    if (fVar12 <= fVar1 + resultOut->m_closestPointDistanceThreshold) {
      fVar11 = 0.0;
      auVar9 = SUB6416(ZEXT464(0x3f800000),0);
      local_68 = auVar9;
      if (1.1920929e-07 < fVar12) {
        fVar11 = 1.0 / fVar12;
        auVar9._0_4_ = fVar11 * (float)local_48._0_4_;
        auVar9._4_4_ = fVar11 * (float)local_48._4_4_;
        auVar9._8_4_ = fVar11 * fStack_40;
        auVar9._12_4_ = fVar11 * fStack_3c;
        fVar11 = fVar11 * fVar3;
        local_68 = vinsertps_avx(auVar9,ZEXT416((uint)fVar11),0x28);
      }
      uVar2 = *(undefined8 *)(col1Wrap->m_worldTransform->m_origin).m_floats;
      auVar10._0_4_ = fVar13 * auVar9._0_4_ + (float)uVar2;
      auVar10._4_4_ = fVar13 * auVar9._4_4_ + (float)((ulong)uVar2 >> 0x20);
      auVar10._8_4_ = fVar13 * auVar9._8_4_ + 0.0;
      auVar10._12_4_ = fVar13 * auVar9._12_4_ + 0.0;
      local_38 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar13 * fVar11 +
                                                     (col1Wrap->m_worldTransform->m_origin).m_floats
                                                     [2])),0x28);
      (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)(fVar12 - fVar1),resultOut,local_68)
      ;
    }
  }
  return;
}

Assistant:

void cbtSphereSphereCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* col0Wrap, const cbtCollisionObjectWrapper* col1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	cbtSphereShape* sphere0 = (cbtSphereShape*)col0Wrap->getCollisionShape();
	cbtSphereShape* sphere1 = (cbtSphereShape*)col1Wrap->getCollisionShape();

	cbtVector3 diff = col0Wrap->getWorldTransform().getOrigin() - col1Wrap->getWorldTransform().getOrigin();
	cbtScalar len = diff.length();
	cbtScalar radius0 = sphere0->getRadius();
	cbtScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold();  //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if (len > (radius0 + radius1 + resultOut->m_closestPointDistanceThreshold))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif  //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	cbtScalar dist = len - (radius0 + radius1);

	cbtVector3 normalOnSurfaceB(1, 0, 0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///cbtVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	cbtVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1 * normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done

	resultOut->addContactPoint(normalOnSurfaceB, pos1, dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif  //CLEAR_MANIFOLD
}